

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                  ARKVecResizeFn resize,void *resize_data)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  SUNNonlinearSolver NLS;
  long liw_diff;
  char *msgfmt;
  long lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    arkProcessError(ark_mem,-0x15,0xc0f,"mriStep_Resize",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  liw1 = 0;
  lrw1 = 0;
  if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    N_VSpace(y0,&lrw1,&liw1);
  }
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;
  if (*(long *)((long)pvVar1 + 0x28) != 0) {
    iVar3 = arkResizeVecArray(resize,resize_data,*(int *)((long)pvVar1 + 0x60),y0,
                              (N_Vector **)((long)pvVar1 + 0x28),lrw_diff,&ark_mem->lrw,liw_diff,
                              &ark_mem->liw);
    if (iVar3 == 0) {
      msgfmt = "Unable to resize vector";
      iVar3 = 0x1a3;
      goto LAB_001571e3;
    }
    if (*(int *)((long)pvVar1 + 0x38) != 0) {
      *(undefined8 *)((long)pvVar1 + 0x30) = *(undefined8 *)((long)pvVar1 + 0x28);
    }
  }
  if (((*(long *)((long)pvVar1 + 0x30) == 0) || (*(int *)((long)pvVar1 + 0x38) != 0)) ||
     (iVar3 = arkResizeVecArray(resize,resize_data,*(int *)((long)pvVar1 + 0x60),y0,
                                (N_Vector **)((long)pvVar1 + 0x30),lrw_diff,&ark_mem->lrw,liw_diff,
                                &ark_mem->liw), iVar3 != 0)) {
    if ((*(long *)((long)pvVar1 + 0x88) == 0) ||
       (iVar3 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                             (N_Vector *)((long)pvVar1 + 0x88)), iVar3 != 0)) {
      if ((*(long *)((long)pvVar1 + 0x90) == 0) ||
         (iVar3 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                               (N_Vector *)((long)pvVar1 + 0x90)), iVar3 != 0)) {
        if ((*(long *)((long)pvVar1 + 0x98) == 0) ||
           (iVar3 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                                 (N_Vector *)((long)pvVar1 + 0x98)), iVar3 != 0)) {
          if ((*(long *)((long)pvVar1 + 0xa8) != 0) && (*(int *)((long)pvVar1 + 0xb0) != 0)) {
            iVar3 = SUNNonlinSolFree();
            if (iVar3 != 0) {
              return iVar3;
            }
            *(undefined8 *)((long)pvVar1 + 0xa8) = 0;
            *(undefined4 *)((long)pvVar1 + 0xb0) = 0;
            NLS = SUNNonlinSol_Newton(y0,ark_mem->sunctx);
            if (NLS == (SUNNonlinearSolver)0x0) {
              msgfmt = "Error creating default Newton solver";
              iVar3 = 0x1e5;
              goto LAB_001571e3;
            }
            iVar3 = ARKodeSetNonlinearSolver(ark_mem,NLS);
            if (iVar3 != 0) {
              msgfmt = "Error attaching default Newton solver";
              iVar3 = 0x1ee;
              goto LAB_001571e3;
            }
            *(undefined4 *)((long)pvVar1 + 0xb0) = 1;
          }
          lVar2 = *(long *)((long)pvVar1 + 0x168);
          if ((lVar2 != 0) &&
             (iVar3 = arkResizeVecArray(resize,resize_data,*(int *)(lVar2 + 0x24),y0,
                                        (N_Vector **)(lVar2 + 0x18),lrw_diff,(long *)(lVar2 + 0x60),
                                        liw_diff,(long *)(lVar2 + 0x68)), iVar3 != 0)) {
            if (*(long *)((long)pvVar1 + 0xa8) == 0) {
              return 0;
            }
            *(undefined8 *)((long)pvVar1 + 0x1a8) = 0;
            return 0;
          }
          msgfmt = "Unable to resize vector";
          iVar3 = 0x1fa;
        }
        else {
          msgfmt = "Unable to resize vector";
          iVar3 = 0x1d1;
        }
      }
      else {
        msgfmt = "Unable to resize vector";
        iVar3 = 0x1c7;
      }
    }
    else {
      msgfmt = "Unable to resize vector";
      iVar3 = 0x1bd;
    }
  }
  else {
    msgfmt = "Unable to resize vector";
    iVar3 = 0x1b1;
  }
LAB_001571e3:
  arkProcessError(ark_mem,-0x14,iVar3,"mriStep_Resize",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                  ,msgfmt);
  return -0x14;
}

Assistant:

int mriStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                   SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                   SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                   void* resize_data)
{
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize Fse */
  if (step_mem->Fse)
  {
    if (!arkResizeVecArray(resize, resize_data, step_mem->nstages_allocated, y0,
                           &(step_mem->Fse), lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
    if (step_mem->unify_Fs) { step_mem->Fsi = step_mem->Fse; }
  }

  /* Resize Fsi */
  if (step_mem->Fsi && !step_mem->unify_Fs)
  {
    if (!arkResizeVecArray(resize, resize_data, step_mem->nstages_allocated, y0,
                           &(step_mem->Fsi), lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  /* Resize the nonlinear solver interface vectors (if applicable) */
  if (step_mem->sdata != NULL)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->sdata))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }
  if (step_mem->zpred != NULL)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->zpred))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }
  if (step_mem->zcor != NULL)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->zcor))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  /* If a NLS object was previously used, destroy and recreate default Newton
     NLS object (can be replaced by user-defined object if desired) */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
  {
    /* destroy existing NLS object */
    retval = SUNNonlinSolFree(step_mem->NLS);
    if (retval != ARK_SUCCESS) { return (retval); }
    step_mem->NLS    = NULL;
    step_mem->ownNLS = SUNFALSE;

    /* create new Newton NLS object */
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error creating default Newton solver");
      return (ARK_MEM_FAIL);
    }

    /* attach new Newton NLS object */
    retval = ARKodeSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error attaching default Newton solver");
      return (ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* Resize the inner stepper vectors */
  retval = mriStepInnerStepper_Resize(step_mem->stepper, resize, resize_data,
                                      lrw_diff, liw_diff, y0);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Unable to resize vector");
    return (ARK_MEM_FAIL);
  }

  /* reset nonlinear solver counters */
  if (step_mem->NLS != NULL) { step_mem->nsetups = 0; }

  return (ARK_SUCCESS);
}